

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_mod_int(mbedtls_mpi_uint *r,mbedtls_mpi *A,mbedtls_mpi_sint b)

{
  ulong uVar1;
  mbedtls_mpi_uint z;
  mbedtls_mpi_uint y;
  mbedtls_mpi_uint x;
  size_t i;
  mbedtls_mpi_sint b_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi_uint *r_local;
  
  if (b == 0) {
    r_local._4_4_ = -0xc;
  }
  else if (b < 0) {
    r_local._4_4_ = -10;
  }
  else if (b == 1) {
    *r = 0;
    r_local._4_4_ = 0;
  }
  else if (b == 2) {
    *r = *A->p & 1;
    r_local._4_4_ = 0;
  }
  else {
    x = A->n;
    z = 0;
    for (; x != 0; x = x - 1) {
      uVar1 = z << 0x20 | A->p[x - 1] >> 0x20;
      uVar1 = uVar1 - (uVar1 / (ulong)b) * b << 0x20 | A->p[x - 1] & 0xffffffff;
      z = uVar1 - (uVar1 / (ulong)b) * b;
    }
    if ((A->s < 0) && (z != 0)) {
      z = b - z;
    }
    *r = z;
    r_local._4_4_ = 0;
  }
  return r_local._4_4_;
}

Assistant:

int mbedtls_mpi_mod_int( mbedtls_mpi_uint *r, const mbedtls_mpi *A, mbedtls_mpi_sint b )
{
    size_t i;
    mbedtls_mpi_uint x, y, z;
    MPI_VALIDATE_RET( r != NULL );
    MPI_VALIDATE_RET( A != NULL );

    if( b == 0 )
        return( MBEDTLS_ERR_MPI_DIVISION_BY_ZERO );

    if( b < 0 )
        return( MBEDTLS_ERR_MPI_NEGATIVE_VALUE );

    /*
     * handle trivial cases
     */
    if( b == 1 )
    {
        *r = 0;
        return( 0 );
    }

    if( b == 2 )
    {
        *r = A->p[0] & 1;
        return( 0 );
    }

    /*
     * general case
     */
    for( i = A->n, y = 0; i > 0; i-- )
    {
        x  = A->p[i - 1];
        y  = ( y << biH ) | ( x >> biH );
        z  = y / b;
        y -= z * b;

        x <<= biH;
        y  = ( y << biH ) | ( x >> biH );
        z  = y / b;
        y -= z * b;
    }

    /*
     * If A is negative, then the current y represents a negative value.
     * Flipping it to the positive side.
     */
    if( A->s < 0 && y != 0 )
        y = b - y;

    *r = y;

    return( 0 );
}